

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlCheckLanguageID(xmlChar *lang)

{
  bool bVar1;
  ulong uVar2;
  byte *pbVar3;
  byte bVar4;
  byte *pbVar5;
  xmlChar *cur;
  byte *pbVar6;
  
  if (lang != (xmlChar *)0x0) {
    bVar4 = *lang;
    if (bVar4 < 0x69) {
      if ((bVar4 == 0x49) || (bVar4 == 0x58)) {
LAB_00132897:
        if (lang[1] == '-') {
          pbVar5 = lang + 2;
          do {
            bVar4 = *pbVar5;
            pbVar5 = pbVar5 + 1;
          } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
          bVar1 = bVar4 == 0;
          goto LAB_00132a7e;
        }
      }
    }
    else if ((bVar4 == 0x78) || (bVar4 == 0x69)) goto LAB_00132897;
    pbVar5 = (byte *)0x0;
    do {
      pbVar3 = pbVar5;
      bVar4 = lang[(long)pbVar3];
      pbVar5 = pbVar3 + 1;
    } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
    if (3 < (long)pbVar3) {
      bVar1 = bVar4 == 0 && pbVar3 < (byte *)0x9;
      goto LAB_00132a7e;
    }
    if (1 < (long)pbVar3) {
      bVar1 = true;
      if (bVar4 == 0) goto LAB_00132a7e;
      if (bVar4 == 0x2d) {
        pbVar3 = lang + (long)pbVar5;
        bVar4 = *pbVar3;
        if ((byte)(bVar4 - 0x30) < 10) {
LAB_0013291a:
          if (((byte)(pbVar3[1] - 0x30) < 10) && ((byte)(pbVar3[2] - 0x30) < 10)) {
            bVar4 = pbVar3[3];
            pbVar3 = pbVar3 + 3;
LAB_00132a4c:
            if (bVar4 == 0) goto LAB_00132a7e;
            if (bVar4 == 0x2d) {
              uVar2 = 0xfffffffffffffff6;
              do {
                bVar4 = pbVar3[uVar2 + 0xb];
                uVar2 = uVar2 + 1;
              } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
              if (0xfffffffffffffffb < uVar2) goto LAB_00132a82;
            }
          }
        }
        else {
          while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a) {
            pbVar6 = pbVar3 + 1;
            pbVar3 = pbVar3 + 1;
            bVar4 = *pbVar6;
          }
          pbVar6 = pbVar3 + (-(long)pbVar5 - (long)lang);
          if (pbVar6 == (byte *)0x2) goto LAB_00132a4c;
          if (pbVar6 == (byte *)0x4) {
LAB_00132988:
            if (bVar4 == 0) goto LAB_00132a7e;
            if (bVar4 == 0x2d) {
              if ((byte)(pbVar3[1] - 0x30) < 10) {
LAB_001329a7:
                pbVar3 = pbVar3 + 1;
                goto LAB_0013291a;
              }
              uVar2 = 0xfffffffffffffffa;
              do {
                bVar4 = pbVar3[1];
                pbVar3 = pbVar3 + 1;
                uVar2 = uVar2 + 1;
              } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
              if (uVar2 < 4) goto LAB_00132a82;
              if (uVar2 == 0xfffffffffffffffd) goto LAB_00132a4c;
            }
          }
          else {
            if (pbVar6 + -5 < (byte *)0x4) {
LAB_00132a82:
              bVar1 = bVar4 == 0x2d || bVar4 == 0;
              goto LAB_00132a7e;
            }
            if (pbVar3 + (-3 - (long)lang) == pbVar5) {
              if (bVar4 == 0) goto LAB_00132a7e;
              if (bVar4 == 0x2d) {
                if ((byte)(pbVar3[1] - 0x30) < 10) goto LAB_001329a7;
                uVar2 = 0xfffffffffffffffa;
                do {
                  bVar4 = pbVar3[1];
                  pbVar3 = pbVar3 + 1;
                  uVar2 = uVar2 + 1;
                } while ((byte)((bVar4 & 0xdf) + 0xbf) < 0x1a);
                if (uVar2 == 0xfffffffffffffffd) goto LAB_00132a4c;
                if (uVar2 < 4) goto LAB_00132a82;
                if (uVar2 == 0xffffffffffffffff) goto LAB_00132988;
              }
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_00132a7e:
  return (int)bVar1;
}

Assistant:

int
xmlCheckLanguageID(const xmlChar * lang)
{
    const xmlChar *cur = lang, *nxt;

    if (cur == NULL)
        return (0);
    if (((cur[0] == 'i') && (cur[1] == '-')) ||
        ((cur[0] == 'I') && (cur[1] == '-')) ||
        ((cur[0] == 'x') && (cur[1] == '-')) ||
        ((cur[0] == 'X') && (cur[1] == '-'))) {
        /*
         * Still allow IANA code and user code which were coming
         * from the previous version of the XML-1.0 specification
         * it's deprecated but we should not fail
         */
        cur += 2;
        while (((cur[0] >= 'A') && (cur[0] <= 'Z')) ||
               ((cur[0] >= 'a') && (cur[0] <= 'z')))
            cur++;
        return(cur[0] == 0);
    }
    nxt = cur;
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur >= 4) {
        /*
         * Reserved
         */
        if ((nxt - cur > 8) || (nxt[0] != 0))
            return(0);
        return(1);
    }
    if (nxt - cur < 2)
        return(0);
    /* we got an ISO 639 code */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have extlang or script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 4)
        goto script;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 3)
        return(0);
    /* we parsed an extlang */
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have script or region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;
    if (nxt - cur == 2)
        goto region;
    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 4)
        return(0);
    /* we parsed a script */
script:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can have region or variant */
    if ((nxt[0] >= '0') && (nxt[0] <= '9'))
        goto region_m49;

    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur >= 5) && (nxt - cur <= 8))
        goto variant;
    if (nxt - cur != 2)
        return(0);
    /* we parsed a region */
region:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);

    nxt++;
    cur = nxt;
    /* now we can just have a variant */
    while (((nxt[0] >= 'A') && (nxt[0] <= 'Z')) ||
           ((nxt[0] >= 'a') && (nxt[0] <= 'z')))
           nxt++;

    if ((nxt - cur < 5) || (nxt - cur > 8))
        return(0);

    /* we parsed a variant */
variant:
    if (nxt[0] == 0)
        return(1);
    if (nxt[0] != '-')
        return(0);
    /* extensions and private use subtags not checked */
    return (1);

region_m49:
    if (((nxt[1] >= '0') && (nxt[1] <= '9')) &&
        ((nxt[2] >= '0') && (nxt[2] <= '9'))) {
        nxt += 3;
        goto region;
    }
    return(0);
}